

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O0

_Bool BinarySource_get_fxp_attrs(BinarySource *src,fxp_attrs *attrs)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  unsigned_long local_20;
  unsigned_long count;
  fxp_attrs *attrs_local;
  BinarySource *src_local;
  
  uVar1 = BinarySource_get_uint32(src->binarysource_);
  attrs->flags = uVar1;
  if ((attrs->flags & 1) != 0) {
    uVar2 = BinarySource_get_uint64(src->binarysource_);
    attrs->size = uVar2;
  }
  if ((attrs->flags & 2) != 0) {
    uVar1 = BinarySource_get_uint32(src->binarysource_);
    attrs->uid = uVar1;
    uVar1 = BinarySource_get_uint32(src->binarysource_);
    attrs->gid = uVar1;
  }
  if ((attrs->flags & 4) != 0) {
    uVar1 = BinarySource_get_uint32(src->binarysource_);
    attrs->permissions = uVar1;
  }
  if ((attrs->flags & 8) != 0) {
    uVar1 = BinarySource_get_uint32(src->binarysource_);
    attrs->atime = uVar1;
    uVar1 = BinarySource_get_uint32(src->binarysource_);
    attrs->mtime = uVar1;
  }
  if ((attrs->flags & 0x80000000) != 0) {
    local_20 = BinarySource_get_uint32(src->binarysource_);
    while ((local_20 != 0 && (src->binarysource_->err == BSE_NO_ERROR))) {
      BinarySource_get_string(src->binarysource_);
      BinarySource_get_string(src->binarysource_);
      local_20 = local_20 - 1;
    }
  }
  return true;
}

Assistant:

bool BinarySource_get_fxp_attrs(BinarySource *src, struct fxp_attrs *attrs)
{
    attrs->flags = get_uint32(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_SIZE)
        attrs->size = get_uint64(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_UIDGID) {
        attrs->uid = get_uint32(src);
        attrs->gid = get_uint32(src);
    }
    if (attrs->flags & SSH_FILEXFER_ATTR_PERMISSIONS)
        attrs->permissions = get_uint32(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_ACMODTIME) {
        attrs->atime = get_uint32(src);
        attrs->mtime = get_uint32(src);
    }
    if (attrs->flags & SSH_FILEXFER_ATTR_EXTENDED) {
        unsigned long count = get_uint32(src);
        while (count--) {
            if (get_err(src)) {
                /* Truncated packet. Don't waste time looking for
                 * attributes that aren't there. Caller should spot
                 * the truncation. */
                break;
            }
            /*
             * We should try to analyse these, if we ever find one
             * we recognise.
             */
            get_string(src);
            get_string(src);
        }
    }
    return true;
}